

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pmlinuxalsa.c
# Opt level: O1

PmError alsa_out_close(PmInternal *midi)

{
  undefined4 *ptr;
  int iVar1;
  int iVar2;
  PmError PVar3;
  
  ptr = (undefined4 *)midi->descriptor;
  if (ptr == (undefined4 *)0x0) {
    PVar3 = pmBadPtr;
  }
  else {
    iVar1 = snd_seq_disconnect_to(seq,ptr[2],*ptr,ptr[1]);
    pm_hosterror = iVar1;
    iVar2 = snd_seq_delete_port(seq,ptr[2]);
    if (iVar1 == 0) {
      pm_hosterror = iVar2;
    }
    if (0 < midi->latency) {
      alsa_unuse_queue();
    }
    snd_midi_event_free(*(undefined8 *)(ptr + 4));
    midi->descriptor = (void *)0x0;
    pm_free(ptr);
    if (pm_hosterror == 0) {
      PVar3 = pmNoData;
    }
    else {
      get_alsa_error_text(pm_hosterror_text,0x100,pm_hosterror);
      PVar3 = pmHostError;
    }
  }
  return PVar3;
}

Assistant:

static PmError alsa_out_close(PmInternal *midi)
{
    alsa_descriptor_type desc = (alsa_descriptor_type) midi->descriptor;
    if (!desc) return pmBadPtr;

    if ((pm_hosterror = snd_seq_disconnect_to(seq, desc->this_port, 
                                              desc->client, desc->port))) {
        // if there's an error, try to delete the port anyway, but don't
        // change the pm_hosterror value so we retain the first error
        snd_seq_delete_port(seq, desc->this_port);
    } else { // if there's no error, delete the port and retain any error
        pm_hosterror = snd_seq_delete_port(seq, desc->this_port);
    }
    if (midi->latency > 0) alsa_unuse_queue();
    snd_midi_event_free(desc->parser);
    midi->descriptor = NULL; /* destroy the pointer to signify "closed" */
    pm_free(desc);
    if (pm_hosterror) {
        get_alsa_error_text(pm_hosterror_text, PM_HOST_ERROR_MSG_LEN, 
                            pm_hosterror);
        return pmHostError;
    }
    return pmNoError;
}